

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_shutdown(void)

{
  _func_void_cio_http_server_ptr *p_Var1;
  cio_error cVar2;
  cio_inet_address *arg1;
  undefined1 local_248 [4];
  cio_error err;
  cio_http_server_configuration config;
  shutdown_args args;
  undefined1 local_178 [4];
  uint i;
  cio_http_server server;
  shutdown_args shutdown_args [2];
  
  server.keepalive_header[0x20] = '\0';
  server._329_7_ = 0;
  shutdown_args[0].close_hook = (_func_void_cio_http_server_ptr *)0x0;
  shutdown_args[0]._8_8_ = http_close_hook;
  shutdown_args[1].close_hook = (_func_void_cio_http_server_ptr *)0x1;
  for (args.expected_result = CIO_SUCCESS; (uint)args.expected_result < 2;
      args.expected_result = args.expected_result + CIO_EOF) {
    config.free_client =
         *(cio_free_client_t *)
          &shutdown_args[(ulong)(uint)args.expected_result - 1].close_hook_call_count;
    p_Var1 = shutdown_args[(uint)args.expected_result].close_hook;
    memcpy(local_248,&DAT_00123800,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address((cio_socket_address *)local_248,arg1,0x1f90);
    cVar2 = cio_http_server_init
                      ((cio_http_server *)local_178,&loop,(cio_http_server_configuration *)local_248
                      );
    UnityAssertEqualNumber
              (0,(long)cVar2,"Server initialization failed!",0x40e,UNITY_DISPLAY_STYLE_INT);
    cVar2 = cio_http_server_shutdown
                      ((cio_http_server *)local_178,(cio_http_server_close_hook_t)config.free_client
                      );
    UnityAssertEqualNumber
              ((ulong)p_Var1 & 0xffffffff,(ulong)http_close_hook_fake.call_count,
               "http close hook was not called correctly",0x410,UNITY_DISPLAY_STYLE_INT);
    args.close_hook._4_4_ = (int)((ulong)p_Var1 >> 0x20);
    UnityAssertEqualNumber
              ((long)args.close_hook._4_4_,(long)cVar2,"Server shutdown failed!",0x411,
               UNITY_DISPLAY_STYLE_INT);
    free_dummy_client(client_socket);
    setUp();
  }
  free_dummy_client(client_socket);
  return;
}

Assistant:

static void test_shutdown(void)
{
	struct shutdown_args {
		void (*close_hook)(const struct cio_http_server *server);
		unsigned int close_hook_call_count;
		enum cio_error expected_result;
	};

	struct shutdown_args shutdown_args[] = {
	    {.close_hook = NULL, .close_hook_call_count = 0, .expected_result = CIO_SUCCESS},
	    {.close_hook = http_close_hook, .close_hook_call_count = 1, .expected_result = CIO_SUCCESS},
	};

	struct cio_http_server server;

	for (unsigned int i = 0; i < ARRAY_SIZE(shutdown_args); i++) {
		struct shutdown_args args = shutdown_args[i];

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");
		err = cio_http_server_shutdown(&server, args.close_hook);
		TEST_ASSERT_EQUAL_MESSAGE(args.close_hook_call_count, http_close_hook_fake.call_count, "http close hook was not called correctly");
		TEST_ASSERT_EQUAL_MESSAGE(args.expected_result, err, "Server shutdown failed!");

		free_dummy_client(client_socket);
		setUp();
	}

	free_dummy_client(client_socket);
}